

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

bool __thiscall
flatbuffers::rust::RustGenerator::TableBuilderTypeNeedsLifetime(RustGenerator *this,Type *type)

{
  FullType FVar1;
  
  FVar1 = anon_unknown_26::GetFullType(type);
  return (0xfff18U >> (FVar1 & (ftVectorOfUnionValue|ftVectorOfString)) & 1) != 0;
}

Assistant:

bool TableBuilderTypeNeedsLifetime(const Type &type) const {
    switch (GetFullType(type)) {
      case ftInteger:
      case ftFloat:
      case ftBool:
      case ftEnumKey:
      case ftUnionKey:
      case ftUnionValue: {
        return false;
      }
      default: {
        return true;
      }
    }
  }